

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::PrefixIncDec(SQCompiler *this,SQInteger token)

{
  int iVar1;
  long arg2;
  SQInteger arg3;
  SQCompiler *in_RSI;
  SQCompiler *in_RDI;
  SQInteger tmp;
  SQInteger src;
  SQInteger diff;
  SQExpState es;
  SQCompiler *in_stack_00000080;
  SQCompiler *in_stack_ffffffffffffffc0;
  SQFuncState *in_stack_ffffffffffffffc8;
  SQInteger arg1;
  SQInteger arg0;
  undefined8 uVar2;
  
  iVar1 = 1;
  if (in_RSI == (SQCompiler *)0x130) {
    iVar1 = -1;
  }
  arg2 = (long)iVar1;
  Lex(in_stack_ffffffffffffffc0);
  arg1 = (in_RDI->_es).etype;
  arg0 = (in_RDI->_es).epos;
  uVar2 = *(undefined8 *)&(in_RDI->_es).donot_get;
  (in_RDI->_es).donot_get = true;
  PrefixedExpr(in_stack_00000080);
  if ((in_RDI->_es).etype == 1) {
    Error(in_RDI,"can\'t \'++\' or \'--\' an expression");
  }
  else if (((in_RDI->_es).etype == 2) || ((in_RDI->_es).etype == 3)) {
    Emit2ArgsOP(in_RSI,(SQOpcode)((ulong)uVar2 >> 0x20),arg0);
  }
  else if ((in_RDI->_es).etype == 4) {
    arg3 = SQFuncState::TopTarget((SQFuncState *)0x11fcd4);
    SQFuncState::AddInstruction
              ((SQFuncState *)in_RSI,(SQOpcode)((ulong)uVar2 >> 0x20),arg0,arg1,arg2,arg3);
  }
  else if ((in_RDI->_es).etype == 5) {
    SQFuncState::PushTarget(in_stack_ffffffffffffffc8,(SQInteger)in_stack_ffffffffffffffc0);
    SQFuncState::AddInstruction
              ((SQFuncState *)in_RSI,(SQOpcode)((ulong)uVar2 >> 0x20),arg0,arg1,arg2,
               (SQInteger)in_stack_ffffffffffffffc8);
    SQFuncState::AddInstruction
              ((SQFuncState *)in_RSI,(SQOpcode)((ulong)uVar2 >> 0x20),arg0,arg1,arg2,
               (SQInteger)in_stack_ffffffffffffffc8);
    SQFuncState::AddInstruction
              ((SQFuncState *)in_RSI,(SQOpcode)((ulong)uVar2 >> 0x20),arg0,arg1,arg2,
               (SQInteger)in_stack_ffffffffffffffc8);
  }
  (in_RDI->_es).etype = arg1;
  (in_RDI->_es).epos = arg0;
  *(undefined8 *)&(in_RDI->_es).donot_get = uVar2;
  return;
}

Assistant:

void PrefixIncDec(SQInteger token)
    {
        SQExpState  es;
        SQInteger diff = (token==TK_MINUSMINUS) ? -1 : 1;
        Lex();
        es = _es;
        _es.donot_get = true;
        PrefixedExpr();
        if(_es.etype==EXPR) {
            Error(_SC("can't '++' or '--' an expression"));
        }
        else if(_es.etype==OBJECT || _es.etype==BASE) {
            Emit2ArgsOP(_OP_INC, diff);
        }
        else if(_es.etype==LOCAL) {
            SQInteger src = _fs->TopTarget();
            _fs->AddInstruction(_OP_INCL, src, src, 0, diff);

        }
        else if(_es.etype==OUTER) {
            SQInteger tmp = _fs->PushTarget();
            _fs->AddInstruction(_OP_GETOUTER, tmp, _es.epos);
            _fs->AddInstruction(_OP_INCL,     tmp, tmp, 0, diff);
            _fs->AddInstruction(_OP_SETOUTER, tmp, _es.epos, tmp);
        }
        _es = es;
    }